

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

UniValue *
AddrmanTableToJSON(vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
                   *tableInfos,CConnman *connman)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  reference ppVar4;
  AddrInfo *in_RDI;
  long in_FS_OFFSET;
  pair<AddrInfo,_AddressPosition> *e;
  vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
  *__range1;
  UniValue *table;
  AddressPosition location;
  const_iterator __end1;
  const_iterator __begin1;
  ostringstream key;
  AddrInfo info;
  AddrInfo *in_stack_fffffffffffffcd8;
  ostream *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  AddrInfo *this;
  UniValue *this_00;
  int iStack_2b0;
  int iStack_2ac;
  CConnman *in_stack_fffffffffffffd80;
  AddrInfo *in_stack_fffffffffffffd88;
  ostringstream local_220 [504];
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (UniValue *)&stack0xffffffffffffffd8;
  this = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  UniValue::UniValue((UniValue *)this,(VType)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffce8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd8);
  std::
  vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
  ::begin((vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
           *)in_stack_fffffffffffffce0);
  std::
  vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
  ::end((vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
         *)in_stack_fffffffffffffce0);
  while (bVar3 = __gnu_cxx::
                 operator==<const_std::pair<AddrInfo,_AddressPosition>_*,_std::vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>_>
                           ((__normal_iterator<const_std::pair<AddrInfo,_AddressPosition>_*,_std::vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>_>
                             *)in_stack_fffffffffffffce8,
                            (__normal_iterator<const_std::pair<AddrInfo,_AddressPosition>_*,_std::vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>_>
                             *)in_stack_fffffffffffffce0), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppVar4 = __gnu_cxx::
             __normal_iterator<const_std::pair<AddrInfo,_AddressPosition>_*,_std::vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>_>
             ::operator*((__normal_iterator<const_std::pair<AddrInfo,_AddressPosition>_*,_std::vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>_>
                          *)in_stack_fffffffffffffcd8);
    AddrInfo::AddrInfo(this,in_RDI);
    uVar1 = (ppVar4->second).bucket;
    uVar2 = (ppVar4->second).position;
    std::__cxx11::ostringstream::ostringstream(local_220);
    in_stack_fffffffffffffce8 = (string *)std::ostream::operator<<(local_220,uVar1);
    in_stack_fffffffffffffce0 = std::operator<<((ostream *)in_stack_fffffffffffffce8,"/");
    std::ostream::operator<<(in_stack_fffffffffffffce0,uVar2);
    std::__cxx11::ostringstream::str();
    AddrmanEntryToJSON(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    UniValue::pushKVEnd(this_00,(string *)this,(UniValue *)in_RDI);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffffcd8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcd8);
    std::__cxx11::ostringstream::~ostringstream(local_220);
    AddrInfo::~AddrInfo(in_stack_fffffffffffffcd8);
    __gnu_cxx::
    __normal_iterator<const_std::pair<AddrInfo,_AddressPosition>_*,_std::vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<AddrInfo,_AddressPosition>_*,_std::vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>_>
                  *)in_stack_fffffffffffffcd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (UniValue *)in_RDI;
}

Assistant:

UniValue AddrmanTableToJSON(const std::vector<std::pair<AddrInfo, AddressPosition>>& tableInfos, CConnman& connman)
{
    UniValue table(UniValue::VOBJ);
    for (const auto& e : tableInfos) {
        AddrInfo info = e.first;
        AddressPosition location = e.second;
        std::ostringstream key;
        key << location.bucket << "/" << location.position;
        // Address manager tables have unique entries so there is no advantage
        // in using UniValue::pushKV, which checks if the key already exists
        // in O(N). UniValue::pushKVEnd is used instead which currently is O(1).
        table.pushKVEnd(key.str(), AddrmanEntryToJSON(info, connman));
    }
    return table;
}